

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O2

void __thiscall
amrex::StateDescriptor::setComponent
          (StateDescriptor *this,int comp,string *nm,BCRec *bcr,BndryFunc *func,InterpBase *a_interp
          ,int max_map_start_comp_,int min_map_end_comp_)

{
  pointer puVar1;
  tuple<amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  tVar2;
  pointer pBVar3;
  undefined8 uVar4;
  __uniq_ptr_data<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>,_true,_true>
  _Var5;
  undefined4 extraout_var;
  
  puVar1 = (this->bc_func).
           super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var5.
  super___uniq_ptr_impl<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  .super__Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>._M_head_impl._0_4_ =
       (**func->_vptr_BndryFunc)(func);
  _Var5.
  super___uniq_ptr_impl<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  .super__Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>._M_head_impl._4_4_ =
       extraout_var;
  tVar2.
  super__Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  .super__Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
         *)&puVar1[comp]._M_t.
            super___uniq_ptr_impl<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
  ;
  puVar1[comp]._M_t.
  super___uniq_ptr_impl<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
       = _Var5.
         super___uniq_ptr_impl<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
         ._M_t.
         super__Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
         .super__Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>._M_head_impl;
  if (tVar2.
      super__Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
      .super__Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>._M_head_impl !=
      (_Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>)0x0) {
    (**(code **)(*(long *)tVar2.
                          super__Tuple_impl<0UL,_amrex::StateDescriptor::BndryFunc_*,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>
                          .super__Head_base<0UL,_amrex::StateDescriptor::BndryFunc_*,_false>.
                          _M_head_impl + 0x10))();
  }
  std::__cxx11::string::_M_assign
            ((string *)
             ((this->names).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + comp));
  pBVar3 = (this->bc).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(undefined8 *)(pBVar3[comp].bc + 4) = *(undefined8 *)(bcr->bc + 4);
  uVar4 = *(undefined8 *)(bcr->bc + 2);
  pBVar3 = pBVar3 + comp;
  *(undefined8 *)pBVar3->bc = *(undefined8 *)bcr->bc;
  *(undefined8 *)(pBVar3->bc + 2) = uVar4;
  (this->mapper_comp).super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
  super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl.
  super__Vector_impl_data._M_start[comp] = a_interp;
  (this->m_primary).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[comp] = 0;
  (this->m_groupsize).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[comp] = 0;
  if ((min_map_end_comp_ | max_map_start_comp_) < 0) {
    min_map_end_comp_ = comp;
    max_map_start_comp_ = comp;
  }
  (this->max_map_start_comp).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[comp] =
       max_map_start_comp_;
  (this->min_map_end_comp).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[comp] =
       min_map_end_comp_;
  return;
}

Assistant:

void
StateDescriptor::setComponent (int                               comp,
                               const std::string&                nm,
                               const BCRec&                      bcr,
                               const StateDescriptor::BndryFunc& func,
                               InterpBase*                       a_interp,
                               int                               max_map_start_comp_,
                               int                               min_map_end_comp_)
{
    bc_func[comp].reset(func.clone());

    names[comp]       = nm;
    bc[comp]          = bcr;
    mapper_comp[comp] = a_interp;
    m_primary[comp]    = false;
    m_groupsize[comp] = 0;

    if (max_map_start_comp_>=0 && min_map_end_comp_>=0)
    {
        BL_ASSERT(comp >= max_map_start_comp_ &&
                  comp <= min_map_end_comp_   &&
                  min_map_end_comp_ < ncomp);
        max_map_start_comp[comp] = max_map_start_comp_;
        min_map_end_comp[comp]   = min_map_end_comp_;
    }
    else
    {
        max_map_start_comp[comp] = comp;
        min_map_end_comp[comp]   = comp;
    }
}